

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ident_v3.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  const_iterator iter;
  string input;
  
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Need something to parse\n");
    exit(1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,argv[1],(allocator<char> *)&iter);
  iter._M_current = input._M_dataplus._M_p;
  poVar2 = std::operator<<((ostream *)&std::cout,"parsing : ");
  poVar2 = std::operator<<(poVar2,(string *)&input);
  std::operator<<(poVar2,"\n");
  bVar1 = boost::spirit::x3::
          phrase_parse<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::x3::plus<boost::spirit::x3::sequence<boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::literal_string<std::__cxx11::string,boost::spirit::char_encoding::standard,boost::spirit::x3::unused_type>,boost::spirit::x3::not_predicate<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>,boost::spirit::x3::difference<boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alpha_tag>,boost::spirit::x3::kleene<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>,boost::spirit::x3::alternative<boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::literal_string<std::__cxx11::string,boost::spirit::char_encoding::standard,boost::spirit::x3::unused_type>,boost::spirit::x3::not_predicate<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>,boost::spirit::x3::lexeme_directive<boost::spirit::x3::sequence<boost::spirit::x3::literal_string<std::__cxx11::string,boost::spirit::char_encoding::standard,boost::spirit::x3::unused_type>,boost::spirit::x3::not_predicate<boost::spirit::x3::char_class<boost::spirit::char_encoding::standard,boost::spirit::x3::alnum_tag>>>>>>>>,boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,boost::spirit::x3::space_tag>>
                    (&iter,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(input._M_dataplus._M_p + input._M_string_length),&program_abi_cxx11_,
                     (char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>
                      *)&boost::spirit::x3::ascii::space,post_skip);
  if (iter._M_current == input._M_dataplus._M_p + input._M_string_length) {
    if (bVar1) {
      iVar3 = 0;
      std::operator<<((ostream *)&std::cout,"Good input\n");
      goto LAB_001015be;
    }
    std::operator<<((ostream *)&std::cout,"Parse failed\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"Failed: didn\'t parse everything\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"stopped ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2," characters from the end ");
    poVar2 = std::operator<<(poVar2,"( \'");
    poVar2 = std::operator<<(poVar2,*iter._M_current);
    std::operator<<(poVar2,"\' )\n");
  }
  iVar3 = 1;
LAB_001015be:
  std::__cxx11::string::~string((string *)&input);
  return iVar3;
}

Assistant:

int main(int argc, char**argv)
{
    if (argc < 2) {
        std::cout << "Need something to parse\n";
        exit(1);
    }

    std::string input(argv[1]);

    auto iter     = input.cbegin();
    auto end_iter = input.cend();

    std::cout << "parsing : " << input << "\n";
    bool r = x3::phrase_parse(iter, end_iter, program, x3::ascii::space);

    if (iter != end_iter) {
        auto distance = end_iter - iter;
        std::cout << "Failed: didn't parse everything\n";
        std::cout << "stopped " << distance << " characters from the end "
                  << "( '" << *iter << "' )\n";
        return 1;
    } else if (r) {
        std::cout << "Good input\n";
        return 0;
    } else {
        std::cout << "Parse failed\n";
        return 1;
    }
}